

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-decompile.cc
# Opt level: O0

int ProgramMain(int argc,char **argv)

{
  FILE *file;
  bool bVar1;
  Enum EVar2;
  char *pcVar3;
  uchar *data;
  size_type size;
  ulong uVar4;
  void *src;
  size_t size_00;
  Callback *callback;
  ReadBinaryOptions *options_00;
  string_view filename;
  string local_708;
  string_view local_6e8;
  undefined1 local_6d8 [8];
  FileStream stream;
  string s;
  Result dummy_result;
  undefined1 local_668 [8];
  ValidateOptions options_1;
  undefined1 local_650 [8];
  ReadBinaryOptions options;
  undefined1 local_628 [7];
  bool kStopOnFirstError;
  Module module;
  Errors errors;
  string_view local_298;
  Result local_284;
  undefined1 local_280 [4];
  Result result;
  vector<unsigned_char,_std::allocator<unsigned_char>_> file_data;
  Callback local_260;
  allocator local_239;
  string local_238;
  anon_class_8_1_de19981d local_218;
  NullCallback local_210;
  anon_class_8_1_416780aa local_1f0;
  Callback local_1e8;
  undefined1 local_1c8 [8];
  OptionParser parser;
  char s_description [208];
  bool fail_on_custom_section_error;
  DecompileOptions decompile_options;
  Features features;
  string outfile;
  string infile;
  char **argv_local;
  int argc_local;
  
  wabt::InitStdio();
  std::__cxx11::string::string((string *)(outfile.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&features.simd_enabled_);
  wabt::Features::Features((Features *)(s_description + 0xcc));
  s_description[0xca] = '\x01';
  memcpy(&parser.on_error_._M_invoker,
         "  Read a file in the WebAssembly binary format, and convert it to\n  a decompiled text file.\n\nexamples:\n  # parse binary file test.wasm and write text file test.dcmp\n  $ wasm-decompile test.wasm -o test.dcmp\n"
         ,0xd0);
  wabt::OptionParser::OptionParser
            ((OptionParser *)local_1c8,"wasm-decompile",(char *)&parser.on_error_._M_invoker);
  local_1f0.outfile = (string *)&features.simd_enabled_;
  std::function<void(char_const*)>::function<ProgramMain(int,char**)::__0,void>
            ((function<void(char_const*)> *)&local_1e8,&local_1f0);
  wabt::OptionParser::AddOption
            ((OptionParser *)local_1c8,'o',"output","FILENAME",
             "Output file for the decompiled file, by default use stdout",&local_1e8);
  std::function<void_(const_char_*)>::~function(&local_1e8);
  wabt::Features::AddOptions((Features *)(s_description + 0xcc),(OptionParser *)local_1c8);
  local_218.fail_on_custom_section_error = (bool *)(s_description + 0xca);
  std::function<void()>::function<ProgramMain(int,char**)::__1,void>
            ((function<void()> *)&local_210,&local_218);
  wabt::OptionParser::AddOption
            ((OptionParser *)local_1c8,"ignore-custom-section-errors",
             "Ignore errors in custom sections",&local_210);
  std::function<void_()>::~function(&local_210);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_238,"filename",&local_239);
  file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)(outfile.field_2._M_local_buf + 8);
  std::function<void(char_const*)>::function<ProgramMain(int,char**)::__2,void>
            ((function<void(char_const*)> *)&local_260,
             (anon_class_8_1_5a8ed95f *)
             &file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  callback = &local_260;
  wabt::OptionParser::AddArgument((OptionParser *)local_1c8,&local_238,One,callback);
  std::function<void_(const_char_*)>::~function(&local_260);
  std::__cxx11::string::~string((string *)&local_238);
  std::allocator<char>::~allocator((allocator<char> *)&local_239);
  wabt::OptionParser::Parse((OptionParser *)local_1c8,argc,argv);
  wabt::OptionParser::~OptionParser((OptionParser *)local_1c8);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_280);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  wabt::string_view::string_view(&local_298,pcVar3);
  filename.size_ = (size_type)local_280;
  filename.data_ = (char *)local_298.size_;
  local_284 = wabt::ReadFile((wabt *)local_298.data_,filename,
                             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)callback);
  bVar1 = wabt::Succeeded(local_284);
  if (bVar1) {
    std::vector<wabt::Error,_std::allocator<wabt::Error>_>::vector
              ((vector<wabt::Error,_std::allocator<wabt::Error>_> *)
               &module.elem_segment_bindings.
                super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
                ._M_h._M_single_bucket);
    wabt::Module::Module((Module *)local_628);
    options._31_1_ = 1;
    wabt::ReadBinaryOptions::ReadBinaryOptions
              ((ReadBinaryOptions *)local_650,(Features *)(s_description + 0xcc),(Stream *)0x0,true,
               true,(bool)(s_description[0xca] & 1));
    pcVar3 = (char *)std::__cxx11::string::c_str();
    data = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_280);
    size = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_280);
    options_00 = (ReadBinaryOptions *)local_650;
    options_1.features._8_4_ =
         wabt::ReadBinaryIr(pcVar3,data,size,options_00,
                            (Errors *)
                            &module.elem_segment_bindings.
                             super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
                             ._M_h._M_single_bucket,(Module *)local_628);
    local_284 = (Result)options_1.features._8_4_;
    bVar1 = wabt::Succeeded((Result)options_1.features._8_4_);
    if (bVar1) {
      options_1.features.simd_enabled_ = (bool)(undefined1)local_284.enum_;
      options_1.features.threads_enabled_ = (bool)local_284.enum_._1_1_;
      options_1.features.multi_value_enabled_ = (bool)local_284.enum_._2_1_;
      options_1.features.tail_call_enabled_ = (bool)local_284.enum_._3_1_;
      bVar1 = wabt::Succeeded(local_284);
      if (bVar1) {
        wabt::ValidateOptions::ValidateOptions
                  ((ValidateOptions *)local_668,(Features *)(s_description + 0xcc));
        local_284 = wabt::ValidateModule
                              ((Module *)local_628,
                               (Errors *)
                               &module.elem_segment_bindings.
                                super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
                                ._M_h._M_single_bucket,(ValidateOptions *)local_668);
      }
      local_284 = wabt::GenerateNames((Module *)local_628,AlphaNames);
      wabt::RenameAll((Module *)local_628);
      bVar1 = wabt::Succeeded(local_284);
      if (bVar1) {
        wabt::ApplyNames((Module *)local_628);
      }
      bVar1 = wabt::Succeeded(local_284);
      if (bVar1) {
        wabt::Decompile_abi_cxx11_
                  ((string *)&stream.should_close_,(wabt *)local_628,
                   (Module *)(s_description + 0xcb),(DecompileOptions *)options_00);
        uVar4 = std::__cxx11::string::empty();
        if ((uVar4 & 1) == 0) {
          wabt::string_view::string_view(&local_6e8,(string *)&features.simd_enabled_);
          wabt::FileStream::FileStream((FileStream *)local_6d8,local_6e8,(Stream *)0x0);
        }
        else {
          wabt::FileStream::FileStream((FileStream *)local_6d8,_stdout,(Stream *)0x0);
        }
        src = (void *)std::__cxx11::string::data();
        size_00 = std::__cxx11::string::size();
        wabt::Stream::WriteData((Stream *)local_6d8,src,size_00,(char *)0x0,No);
        wabt::FileStream::~FileStream((FileStream *)local_6d8);
        std::__cxx11::string::~string((string *)&stream.should_close_);
      }
    }
    file = _stderr;
    std::__cxx11::string::string((string *)&local_708);
    wabt::FormatErrorsToFile
              ((Errors *)
               &module.elem_segment_bindings.
                super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
                ._M_h._M_single_bucket,Binary,(LexerSourceLineFinder *)0x0,file,&local_708,Never,
               0x50);
    std::__cxx11::string::~string((string *)&local_708);
    wabt::Module::~Module((Module *)local_628);
    std::vector<wabt::Error,_std::allocator<wabt::Error>_>::~vector
              ((vector<wabt::Error,_std::allocator<wabt::Error>_> *)
               &module.elem_segment_bindings.
                super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
                ._M_h._M_single_bucket);
  }
  EVar2 = wabt::Result::operator_cast_to_Enum(&local_284);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_280);
  std::__cxx11::string::~string((string *)&features.simd_enabled_);
  std::__cxx11::string::~string((string *)(outfile.field_2._M_local_buf + 8));
  return (uint)(EVar2 != Ok);
}

Assistant:

int ProgramMain(int argc, char** argv) {
  InitStdio();

  std::string infile;
  std::string outfile;
  Features features;
  DecompileOptions decompile_options;
  bool fail_on_custom_section_error = true;

  {
    const char s_description[] =
      "  Read a file in the WebAssembly binary format, and convert it to\n"
      "  a decompiled text file.\n"
      "\n"
      "examples:\n"
      "  # parse binary file test.wasm and write text file test.dcmp\n"
      "  $ wasm-decompile test.wasm -o test.dcmp\n";
    OptionParser parser("wasm-decompile", s_description);
    parser.AddOption(
        'o', "output", "FILENAME",
        "Output file for the decompiled file, by default use stdout",
        [&](const char* argument) {
          outfile = argument;
          ConvertBackslashToSlash(&outfile);
        });
    features.AddOptions(&parser);
    parser.AddOption("ignore-custom-section-errors",
                     "Ignore errors in custom sections",
                     [&]() { fail_on_custom_section_error = false; });
    parser.AddArgument("filename", OptionParser::ArgumentCount::One,
                       [&](const char* argument) {
                         infile = argument;
                         ConvertBackslashToSlash(&infile);
                       });
    parser.Parse(argc, argv);
  }

  std::vector<uint8_t> file_data;
  Result result = ReadFile(infile.c_str(), &file_data);
  if (Succeeded(result)) {
    Errors errors;
    Module module;
    const bool kStopOnFirstError = true;
    ReadBinaryOptions options(features, nullptr,
                              true, kStopOnFirstError,
                              fail_on_custom_section_error);
    result = ReadBinaryIr(infile.c_str(), file_data.data(), file_data.size(),
                          options, &errors, &module);
    if (Succeeded(result)) {
      if (Succeeded(result)) {
        ValidateOptions options(features);
        result = ValidateModule(&module, &errors, options);
      }
      result = GenerateNames(&module,
                             static_cast<NameOpts>(NameOpts::AlphaNames));
      // Must be called after ReadBinaryIr & GenerateNames, and before
      // ApplyNames, see comments at definition.
      RenameAll(module);
      if (Succeeded(result)) {
        /* TODO(binji): This shouldn't fail; if a name can't be applied
         * (because the index is invalid, say) it should just be skipped. */
        Result dummy_result = ApplyNames(&module);
        WABT_USE(dummy_result);
      }
      if (Succeeded(result)) {
        auto s = Decompile(module, decompile_options);
        FileStream stream(!outfile.empty() ? FileStream(outfile)
                                             : FileStream(stdout));
        stream.WriteData(s.data(), s.size());
      }
    }
    FormatErrorsToFile(errors, Location::Type::Binary);
  }
  return result != Result::Ok;
}